

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall
cfd::core::Psbt::SetTxInSignature(Psbt *this,uint32_t index,KeyData *key,ByteData *signature)

{
  long lVar1;
  uchar *puVar2;
  size_type sVar3;
  uchar *puVar4;
  size_type sVar5;
  CfdException *this_00;
  allocator local_e1;
  string local_e0;
  CfdSourceLocation local_c0;
  int local_a4;
  undefined1 local_a0 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  Pubkey local_78;
  ByteData local_60;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  wally_psbt *psbt_pointer;
  ByteData *signature_local;
  KeyData *key_local;
  uint32_t index_local;
  Psbt *this_local;
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0x953,"SetTxInSignature");
  pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this->wally_psbt_pointer_;
  KeyData::GetPubkey(&local_78,key);
  Pubkey::GetData(&local_60,&local_78);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,&local_60);
  ByteData::~ByteData(&local_60);
  Pubkey::~Pubkey(&local_78);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,signature);
  lVar1 = *(long *)(pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage + 0x10);
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  local_a4 = wally_psbt_input_add_signature(lVar1 + (ulong)index * 0x110,puVar2,sVar3,puVar4,sVar5);
  if (local_a4 != 0) {
    local_c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_c0.filename = local_c0.filename + 1;
    local_c0.line = 0x95d;
    local_c0.funcname = "SetTxInSignature";
    logger::warn<int&>(&local_c0,"wally_psbt_input_add_signature NG[{}]",&local_a4);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_e0,"psbt add input sig error.",&local_e1);
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_e0);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return;
}

Assistant:

void Psbt::SetTxInSignature(
    uint32_t index, const KeyData &key, const ByteData &signature) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  auto pubkey = key.GetPubkey().GetData().GetBytes();
  auto sig = signature.GetBytes();

  int ret = wally_psbt_input_add_signature(
      &psbt_pointer->inputs[index], pubkey.data(), pubkey.size(), sig.data(),
      sig.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_input_add_signature NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt add input sig error.");
  }
}